

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppendNew(sqlite3 *db,Expr *pExpr)

{
  ExprList *pList;
  ExprList_item *pItem;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,0x80);
  if (db_local == (sqlite3 *)0x0) {
    sqlite3ExprDelete(db,pExpr);
    db_local = (sqlite3 *)0x0;
  }
  else {
    *(undefined4 *)((long)&db_local->pVfs + 4) = 4;
    *(undefined4 *)&db_local->pVfs = 1;
    db_local->pVdbe = (Vdbe *)(Expr *)0x0;
    db_local->pDfltColl = (CollSeq *)(char *)0x0;
    db_local->mutex = (sqlite3_mutex *)0;
    db_local->pVdbe = (Vdbe *)pExpr;
  }
  return (ExprList *)db_local;
}

Assistant:

ExprList *sqlite3ExprListAppendNew(
  sqlite3 *db,            /* Database handle.  Used for memory allocation */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  ExprList *pList;

  pList = sqlite3DbMallocRawNN(db, sizeof(ExprList)+sizeof(pList->a[0])*4 );
  if( pList==0 ){
    sqlite3ExprDelete(db, pExpr);
    return 0;
  }
  pList->nAlloc = 4;
  pList->nExpr = 1;
  pItem = &pList->a[0];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}